

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

void pax_time(char *p,size_t length,int64_t *ps,long *pn)

{
  bool bVar1;
  int64_t last_digit_limit;
  int64_t limit;
  ulong uStack_40;
  wchar_t sign;
  unsigned_long l;
  int64_t s;
  char digit;
  long *pn_local;
  int64_t *ps_local;
  size_t length_local;
  char *p_local;
  
  if (length == 0) {
    *ps = 0;
  }
  else {
    l = 0;
    limit._4_4_ = 1;
    ps_local = (int64_t *)length;
    length_local = (size_t)p;
    if (*p == '-') {
      limit._4_4_ = -1;
      length_local = (size_t)(p + 1);
      ps_local = (int64_t *)(length - 1);
    }
    while( true ) {
      bVar1 = false;
      if ((ps_local != (int64_t *)0x0) && (bVar1 = false, '/' < *(char *)length_local)) {
        bVar1 = *(char *)length_local < ':';
      }
      if (!bVar1) goto LAB_00158fdd;
      if ((0xccccccccccccccc < (long)l) ||
         ((l == 0xccccccccccccccc && ('\a' < (char)(*(char *)length_local + -0x30))))) break;
      l = l * 10 + (long)(char)(*(char *)length_local + -0x30);
      length_local = length_local + 1;
      ps_local = (int64_t *)((long)ps_local + -1);
    }
    l = 0x7fffffffffffffff;
LAB_00158fdd:
    *ps = l * (long)limit._4_4_;
    *pn = 0;
    if ((ps_local != (int64_t *)0x0) && (*(char *)length_local == '.')) {
      uStack_40 = 100000000;
      do {
        length_local = length_local + 1;
        ps_local = (int64_t *)((long)ps_local + -1);
        if (ps_local == (int64_t *)0x0) {
          return;
        }
        if (*(char *)length_local < '0') {
          return;
        }
        if ('9' < *(char *)length_local) {
          return;
        }
        *pn = (long)(*(char *)length_local + -0x30) * uStack_40 + *pn;
        uStack_40 = uStack_40 / 10;
      } while (uStack_40 != 0);
    }
  }
  return;
}

Assistant:

static void
pax_time(const char *p, size_t length, int64_t *ps, long *pn)
{
	char digit;
	int64_t	s;
	unsigned long l;
	int sign;
	int64_t limit, last_digit_limit;

	limit = INT64_MAX / 10;
	last_digit_limit = INT64_MAX % 10;

	if (length <= 0) {
		*ps = 0;
		return;
	}
	s = 0;
	sign = 1;
	if (*p == '-') {
		sign = -1;
		p++;
		length--;
	}
	while (length > 0 && *p >= '0' && *p <= '9') {
		digit = *p - '0';
		if (s > limit ||
		    (s == limit && digit > last_digit_limit)) {
			s = INT64_MAX;
			break;
		}
		s = (s * 10) + digit;
		++p;
		--length;
	}

	*ps = s * sign;

	/* Calculate nanoseconds. */
	*pn = 0;

	if (length <= 0 || *p != '.')
		return;

	l = 100000000UL;
	do {
		++p;
		--length;
		if (length > 0 && *p >= '0' && *p <= '9')
			*pn += (*p - '0') * l;
		else
			break;
	} while (l /= 10);
}